

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * Cudd_addPermute(DdManager *manager,DdNode *node,int *permut)

{
  int *piVar1;
  DdHashTable *table;
  DdNode *pDVar2;
  
  do {
    manager->reordered = 0;
    table = cuddHashTableInit(manager,1,2);
    if (table == (DdHashTable *)0x0) goto LAB_0066685d;
    pDVar2 = cuddAddPermuteRecur(manager,table,node,permut);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    cuddHashTableQuit(table);
  } while (manager->reordered == 1);
  if (pDVar2 == (DdNode *)0x0) {
LAB_0066685d:
    pDVar2 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addPermute(
  DdManager * manager,
  DdNode * node,
  int * permut)
{
    DdHashTable         *table;
    DdNode              *res;

    do {
        manager->reordered = 0;
        table = cuddHashTableInit(manager,1,2);
        if (table == NULL) return(NULL);
        /* Recursively solve the problem. */
        res = cuddAddPermuteRecur(manager,table,node,permut);
        if (res != NULL) cuddRef(res);
        /* Dispose of local cache. */
        cuddHashTableQuit(table);
    } while (manager->reordered == 1);

    if (res != NULL) cuddDeref(res);
    return(res);

}